

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_metadata.cpp
# Opt level: O3

bool __thiscall
libtorrent::anon_unknown_5::ut_metadata_plugin::received_metadata
          (ut_metadata_plugin *this,ut_metadata_peer_plugin *source,span<const_char> buf,int piece,
          int total_size)

{
  vector<metadata_piece> *this_00;
  int iVar1;
  uint uVar2;
  pointer pcVar3;
  pointer pcVar4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar6;
  undefined1 extraout_AL;
  int iVar7;
  uint uVar8;
  undefined4 extraout_var;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  time_point tVar9;
  ulong extraout_RAX_02;
  undefined8 *puVar10;
  char *pcVar11;
  pointer pmVar12;
  pointer pmVar13;
  long lVar14;
  bt_peer_connection *this_02;
  ulong uVar15;
  ulong uVar16;
  time_point tVar17;
  vector<char> *__c;
  bool bVar18;
  span<const_char> metadata_buf;
  undefined1 local_50 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  vector<char> *local_40;
  char *local_38;
  
  pcVar11 = buf.m_ptr;
  if (0 < (((this->m_torrent->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          m_files).m_piece_length) {
    aux::peer_connection::peer_log
              (&source->m_pc->super_peer_connection,info,"UT_METADATA","already have metadata");
    aux::torrent::add_redundant_bytes(this->m_torrent,(int)buf.m_len,piece_unknown);
    return (bool)extraout_AL;
  }
  uVar15 = (ulong)(uint)piece;
  __c = &this->m_metadata;
  if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start ==
      (this->m_metadata).super_vector<char,_std::allocator<char>_>.
      super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish) {
    local_38 = pcVar11;
    if (0 < total_size) {
      iVar7 = (*(((this->m_torrent->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[0x2e])();
      local_50 = (undefined1  [8])(CONCAT44(extraout_var,iVar7) + 0x438);
      local_48._M_pi = local_48._M_pi & 0xffffffffffffff00;
      local_40 = __c;
      ::std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_50);
      local_48._M_pi._0_1_ = 1;
      iVar7 = *(int *)(CONCAT44(extraout_var,iVar7) + 0x338);
      ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_50);
      __c = local_40;
      if (total_size <= iVar7) {
        ::std::vector<char,_std::allocator<char>_>::resize
                  (&local_40->super_vector<char,_std::allocator<char>_>,(ulong)(uint)total_size);
        aux::
        container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
        ::resize<int,void>((container_wrapper<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,int,std::vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>>>
                            *)&this->m_requested_metadata,total_size + 0x3fffU >> 0xe);
        pcVar11 = local_38;
        goto LAB_0039f5f0;
      }
    }
    this_02 = source->m_pc;
    pcVar11 = "metadata size too big: %d";
    uVar15 = (ulong)(uint)total_size;
  }
  else {
LAB_0039f5f0:
    if ((-1 < piece) &&
       (piece < (int)((ulong)((long)(this->m_requested_metadata).
                                    super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                    .
                                    super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_requested_metadata).
                                   super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                   .
                                   super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 5))) {
      pcVar3 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pcVar4 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      uVar16 = (long)pcVar4 - (long)pcVar3;
      if ((int)uVar16 != total_size) {
        if (pcVar3 == pcVar4) {
          peVar5 = (this->m_torrent->super_torrent_hot_members).m_torrent_file.
                   super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar5->m_files).m_piece_length < 1) {
            uVar16 = 0;
          }
          else {
            uVar16 = (ulong)(uint)peVar5->m_info_section_size;
          }
        }
        aux::peer_connection::peer_log
                  (&source->m_pc->super_peer_connection,info,"UT_METADATA",
                   "total_size: %d INCONSISTENT WITH: %d",(ulong)(uint)total_size,uVar16);
        tVar9.__d.__r = (duration)(duration)extraout_RAX_00;
        goto LAB_0039f6de;
      }
      tVar9.__d.__r = (duration)(ulong)(uint)(piece << 0xe);
      if (pcVar3 == pcVar4) {
        peVar5 = (this->m_torrent->super_torrent_hot_members).m_torrent_file.
                 super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar5->m_files).m_piece_length < 1) {
          uVar16 = 0;
        }
        else {
          uVar16 = (ulong)peVar5->m_info_section_size;
        }
      }
      if ((long)uVar16 < (long)tVar9.__d.__r + buf.m_len) goto LAB_0039f6de;
      this_00 = &this->m_requested_metadata;
      memcpy(pcVar3 + (long)tVar9.__d.__r,pcVar11,buf.m_len);
      (this_00->
      super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
      ).
      super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar15].num_requests = 0x7fffffff;
      local_48._M_pi =
           (source->
           super_enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
           )._M_weak_this.
           super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if (local_48._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0039f9a8:
        puVar10 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar10 = if_nametoindex;
        __cxa_throw(puVar10,&::std::bad_weak_ptr::typeinfo,::std::bad_weak_ptr::~bad_weak_ptr);
      }
      iVar7 = (local_48._M_pi)->_M_use_count;
      do {
        if (iVar7 == 0) goto LAB_0039f9a8;
        LOCK();
        iVar1 = (local_48._M_pi)->_M_use_count;
        bVar18 = iVar7 == iVar1;
        if (bVar18) {
          (local_48._M_pi)->_M_use_count = iVar7 + 1;
          iVar1 = iVar7;
        }
        iVar7 = iVar1;
        UNLOCK();
      } while (!bVar18);
      local_50 = (undefined1  [8])
                 (source->
                 super_enable_shared_from_this<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin>
                 )._M_weak_this.
                 super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
      pmVar13 = (this_00->
                super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ).
                super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pmVar13[uVar15].source.
      super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)local_50;
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&pmVar13[uVar15].source.
                  super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,&local_48);
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      pmVar13 = (this->m_requested_metadata).
                super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                .
                super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                ._M_impl.super__Vector_impl_data._M_start;
      tVar9.__d.__r =
           (duration)
           (this->m_requested_metadata).
           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           .
           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      uVar15 = (long)tVar9.__d.__r - (long)pmVar13;
      if (0 < (long)uVar15 >> 7) {
        pmVar12 = (pointer)((long)&pmVar13->num_requests + (uVar15 & 0xffffffffffffff80));
        lVar14 = ((long)uVar15 >> 7) + 1;
        pmVar13 = pmVar13 + 2;
        do {
          if (pmVar13[-2].num_requests != 0x7fffffff) {
            pmVar13 = pmVar13 + -2;
            goto LAB_0039f8af;
          }
          if (pmVar13[-1].num_requests != 0x7fffffff) {
            pmVar13 = pmVar13 + -1;
            goto LAB_0039f8af;
          }
          if (pmVar13->num_requests != 0x7fffffff) goto LAB_0039f8af;
          if (pmVar13[1].num_requests != 0x7fffffff) {
            pmVar13 = pmVar13 + 1;
            goto LAB_0039f8af;
          }
          lVar14 = lVar14 + -1;
          pmVar13 = pmVar13 + 4;
        } while (1 < lVar14);
        uVar15 = (long)tVar9.__d.__r - (long)pmVar12;
        pmVar13 = pmVar12;
      }
      lVar14 = (long)uVar15 >> 5;
      if (lVar14 == 1) {
LAB_0039f868:
        if (pmVar13->num_requests == 0x7fffffff) {
          pmVar13 = (pointer)tVar9.__d.__r;
        }
LAB_0039f8af:
        if ((duration)pmVar13 != tVar9.__d.__r) goto LAB_0039f6de;
      }
      else {
        if (lVar14 == 2) {
LAB_0039f85c:
          if (pmVar13->num_requests == 0x7fffffff) {
            pmVar13 = pmVar13 + 1;
            goto LAB_0039f868;
          }
          goto LAB_0039f8af;
        }
        if (lVar14 == 3) {
          if (pmVar13->num_requests == 0x7fffffff) {
            pmVar13 = pmVar13 + 1;
            goto LAB_0039f85c;
          }
          goto LAB_0039f8af;
        }
      }
      pcVar3 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
               super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
               _M_start;
      metadata_buf.m_len =
           (long)(this->m_metadata).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_finish - (long)pcVar3;
      metadata_buf.m_ptr = pcVar3;
      bVar18 = aux::torrent::set_metadata(this->m_torrent,metadata_buf);
      if (bVar18) {
        pcVar3 = (this->m_metadata).super_vector<char,_std::allocator<char>_>.
                 super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
                 _M_start;
        if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_finish != pcVar3) {
          (this->m_metadata).super_vector<char,_std::allocator<char>_>.
          super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
               = pcVar3;
        }
        if ((this->m_metadata).super_vector<char,_std::allocator<char>_>.
            super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage != pcVar3) {
          ::std::__shrink_to_fit_aux<std::vector<char,_std::allocator<char>_>,_true>::_S_do_it
                    (&__c->super_vector<char,_std::allocator<char>_>);
        }
        ::std::
        vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
        ::_M_erase_at_end(&this_00->
                           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                          ,(this_00->
                           super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                           ).
                           super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                           ._M_impl.super__Vector_impl_data._M_start);
        ::std::
        vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
        ::shrink_to_fit(&this_00->
                         super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                       );
        tVar9.__d.__r = (duration)(duration)extraout_RAX_01;
      }
      else {
        tVar9.__d.__r =
             (duration)
             (this->m_torrent->super_torrent_hot_members).m_torrent_file.
             super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((((element_type *)tVar9.__d.__r)->m_files).m_piece_length < 1) {
          tVar9 = aux::time_now();
          pmVar13 = (this->m_requested_metadata).
                    super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                    .
                    super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pmVar12 = (this->m_requested_metadata).
                    super_vector<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                    .
                    super__Vector_base<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece,_std::allocator<libtorrent::(anonymous_namespace)::ut_metadata_plugin::metadata_piece>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          if (pmVar13 != pmVar12) {
            tVar17.__d.__r = (duration)(duration)((long)tVar9.__d.__r + 300000000000);
            if ((long)pmVar12 - (long)pmVar13 != 0x20) {
              tVar17 = tVar9;
            }
            do {
              pmVar13->num_requests = 0;
              this_01 = (pmVar13->source).
                        super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi;
              if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                tVar9.__d.__r = (duration)(ulong)(uint)this_01->_M_use_count;
                do {
                  uVar8 = SUB84(tVar9.__d.__r,0);
                  if (uVar8 == 0) goto LAB_0039f99a;
                  LOCK();
                  uVar2 = this_01->_M_use_count;
                  if (uVar8 == uVar2) {
                    this_01->_M_use_count = uVar8 + 1;
                  }
                  else {
                    tVar9.__d.__r = (duration)(ulong)uVar2;
                  }
                  UNLOCK();
                } while (uVar8 != uVar2);
                if ((this_01->_M_use_count != 0) &&
                   (peVar6 = (pmVar13->source).
                             super___weak_ptr<libtorrent::(anonymous_namespace)::ut_metadata_peer_plugin,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr, peVar6 != (element_type *)0x0)) {
                  lVar14 = aux::random((aux *)0x32);
                  (peVar6->m_request_limit).__d.__r =
                       (ulong)((int)lVar14 + 0x14) * 1000000000 + (long)tVar17.__d.__r;
                }
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
                tVar9.__d.__r = (duration)(duration)extraout_RAX_02;
              }
LAB_0039f99a:
              pmVar13 = pmVar13 + 1;
            } while (pmVar13 != pmVar12);
          }
        }
      }
      goto LAB_0039f6de;
    }
    this_02 = source->m_pc;
    pcVar11 = "piece: %d INVALID";
  }
  aux::peer_connection::peer_log(&this_02->super_peer_connection,info,"UT_METADATA",pcVar11,uVar15);
  tVar9.__d.__r = (duration)(duration)extraout_RAX;
LAB_0039f6de:
  return SUB81(tVar9.__d.__r,0);
}

Assistant:

bool ut_metadata_plugin::received_metadata(ut_metadata_peer_plugin& source
		, span<char const> buf, int const piece, int const total_size)
	{
		if (m_torrent.valid_metadata())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "already have metadata");
#endif
			m_torrent.add_redundant_bytes(static_cast<int>(buf.size()), aux::waste_reason::piece_unknown);
			return false;
		}

		if (m_metadata.empty())
		{
			// verify the total_size
			if (total_size <= 0 || total_size > m_torrent.session().settings().get_int(settings_pack::max_metadata_size))
			{
#ifndef TORRENT_DISABLE_LOGGING
				source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
					, "metadata size too big: %d", total_size);
#endif
// #error post alert
				return false;
			}

			m_metadata.resize(total_size);
			m_requested_metadata.resize(div_round_up(total_size, 16 * 1024));
		}

		if (piece < 0 || piece >= m_requested_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "piece: %d INVALID", piece);
#endif
			return false;
		}

		if (total_size != m_metadata.end_index())
		{
#ifndef TORRENT_DISABLE_LOGGING
			source.m_pc.peer_log(peer_log_alert::info, "UT_METADATA"
				, "total_size: %d INCONSISTENT WITH: %d"
				, total_size, int(metadata().size()));
#endif
			// they disagree about the size!
			return false;
		}

		if (piece * 16 * 1024 + buf.size() > metadata().size())
		{
			// this piece is invalid
			return false;
		}

		std::memcpy(&m_metadata[piece * 16 * 1024], buf.data(), aux::numeric_cast<std::size_t>(buf.size()));
		// mark this piece has 'have'
		m_requested_metadata[piece].num_requests = std::numeric_limits<int>::max();
		m_requested_metadata[piece].source = source.shared_from_this();

		bool have_all = std::all_of(m_requested_metadata.begin(), m_requested_metadata.end()
			, [](metadata_piece const& mp) { return mp.num_requests == std::numeric_limits<int>::max(); });

		if (!have_all) return false;

		if (!m_torrent.set_metadata(m_metadata))
		{
			if (!m_torrent.valid_metadata())
			{
				time_point const now = aux::time_now();
				// any peer that we downloaded metadata from gets a random time
				// penalty, from 5 to 30 seconds or so. During this time we don't
				// make any metadata requests from those peers (to mix it up a bit
				// of which peers we use)
				// if we only have one block, and thus requested it from a single
				// peer, we bump up the retry time a lot more to try other peers
				bool single_peer = m_requested_metadata.size() == 1;
				for (auto& mp : m_requested_metadata)
				{
					mp.num_requests = 0;
					auto peer = mp.source.lock();
					if (!peer) continue;

					peer->failed_hash_check(single_peer ? now + minutes(5) : now);
				}
			}
			return false;
		}

		// free our copy of the metadata and get a reference
		// to the torrent's copy instead. No need to keep two
		// identical copies around
		m_metadata.clear();
		m_metadata.shrink_to_fit();

		// clear the storage for the bitfield
		m_requested_metadata.clear();
		m_requested_metadata.shrink_to_fit();

		return true;
	}